

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

void __thiscall
RoomAndComfortableBed2_Test8_Test::RoomAndComfortableBed2_Test8_Test
          (RoomAndComfortableBed2_Test8_Test *this)

{
  RoomAndComfortableBed2_Test8_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__RoomAndComfortableBed2_Test8_Test_0023e900;
  return;
}

Assistant:

TEST(RoomAndComfortableBed2, Test8){
    Infector::Container ioc;

    ioc.bindSingleAs<ComfortableBedVS,  IBedVS>();
    ioc.bindSingleAs<BedRoomVS,         IRoomVS>();

    ioc.wire<ComfortableBedVS>();
    ioc.wire<BedRoomVS,           IBedVS>();

    auto room = ioc.buildSingle<IRoomVS>();
    room->interact();

    EXPECT_EQ(1, CCallBedVS);
    EXPECT_EQ(1, CCallRoomVS);
}